

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::ContainerPrinter::
     PrintValue<std::vector<jessilib::object,std::allocator<jessilib::object>>,void>
               (vector<jessilib::object,_std::allocator<jessilib::object>_> *container,ostream *os)

{
  pointer poVar1;
  bool bVar2;
  long lVar3;
  object *elem;
  pointer poVar4;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_33,1);
  poVar4 = (container->super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>).
           _M_impl.super__Vector_impl_data._M_start;
  poVar1 = (container->super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (poVar4 != poVar1) {
    lVar3 = 0;
    do {
      if (lVar3 == 0) {
LAB_001d17b7:
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_34,1);
        testing::internal::PrintBytesInObjectTo((uchar *)poVar4,0x40,os);
        lVar3 = lVar3 + 1;
        bVar2 = false;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_35,1);
        if (lVar3 != 0x20) goto LAB_001d17b7;
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        lVar3 = 0x20;
        bVar2 = true;
      }
    } while ((!bVar2) && (poVar4 = poVar4 + 1, poVar4 != poVar1));
    if (lVar3 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }